

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::WriteEquals
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  char *this_00;
  Type TVar1;
  string_view local_30;
  char *local_20;
  char *text;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  local_20 = "if ($property_name$ != other.$property_name$) return false;\n";
  text = (char *)printer;
  printer_local = (Printer *)this;
  TVar1 = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
  if (TVar1 == TYPE_FLOAT) {
    local_20 = 
    "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
    ;
  }
  else {
    TVar1 = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
    if (TVar1 == TYPE_DOUBLE) {
      local_20 = 
      "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
      ;
    }
  }
  this_00 = text;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,local_20);
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)this_00,&(this->super_FieldGeneratorBase).variables_,local_30);
  return;
}

Assistant:

void PrimitiveFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  } else if (descriptor_->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}